

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vpu_api_mlvec.cpp
# Opt level: O0

MPP_RET vpu_api_mlvec_setup(VpuApiMlvec ctx,MppCtx mpp,MppApi *mpi,MppEncCfg enc_cfg)

{
  VpuApiMlvecImpl *impl;
  MppEncCfg enc_cfg_local;
  MppApi *mpi_local;
  MppCtx mpp_local;
  VpuApiMlvec ctx_local;
  
  if ((((ctx == (VpuApiMlvec)0x0) || (mpp == (MppCtx)0x0)) || (mpi == (MppApi *)0x0)) ||
     (enc_cfg == (MppEncCfg)0x0)) {
    _mpp_log_l(2,"vpu_api_mlvec","invalid NULL input ctx %p mpp %p mpi %p cfg %p\n",
               "vpu_api_mlvec_setup",ctx,mpp,mpi,enc_cfg);
    ctx_local._4_4_ = MPP_ERR_NULL_PTR;
  }
  else {
    if ((vpu_api_debug & 0x10000) != 0) {
      _mpp_log_l(4,"vpu_api_mlvec","enter %p\n","vpu_api_mlvec_setup",ctx);
    }
    *(MppCtx *)ctx = mpp;
    *(MppApi **)((long)ctx + 8) = mpi;
    *(MppEncCfg *)((long)ctx + 0x10) = enc_cfg;
    if ((vpu_api_debug & 0x10000) != 0) {
      _mpp_log_l(4,"vpu_api_mlvec","leave %p\n","vpu_api_mlvec_setup",ctx);
    }
    ctx_local._4_4_ = MPP_OK;
  }
  return ctx_local._4_4_;
}

Assistant:

MPP_RET vpu_api_mlvec_setup(VpuApiMlvec ctx, MppCtx mpp, MppApi *mpi, MppEncCfg enc_cfg)
{
    if (NULL == ctx || NULL == mpp || NULL == mpi || NULL == enc_cfg) {
        mpp_err_f("invalid NULL input ctx %p mpp %p mpi %p cfg %p\n",
                  ctx, mpp, mpi, enc_cfg);
        return MPP_ERR_NULL_PTR;
    }

    mlvec_dbg_func("enter %p\n", ctx);

    VpuApiMlvecImpl *impl = (VpuApiMlvecImpl *)ctx;
    impl->mpp = mpp;
    impl->mpi = mpi;
    impl->enc_cfg = enc_cfg;

    mlvec_dbg_func("leave %p\n", ctx);

    return MPP_OK;
}